

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::FindElementHelper(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  ON_SN_BLOCK *this_00;
  bool bVar1;
  ON__UINT64 OVar2;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT *local_60;
  SN_ELEMENT *local_58;
  SN_ELEMENT *local_48;
  SN_ELEMENT *e;
  size_t j;
  size_t i;
  ON_SN_BLOCK *eblk;
  ON_SN_BLOCK **eblk_array;
  ON__UINT64 sn_local;
  ON_SerialNumberMap *this_local;
  
  OVar2 = ON_SerialNumberMapPrivate::MaxSn(this->m_private);
  if ((sn <= OVar2) &&
     (((0xfffffffe < sn ||
       (OVar2 = ON_SerialNumberMapPrivate::LowerMaxSn(this->m_private), sn <= OVar2)) && (sn != 0)))
     ) {
    if ((sn <= this->m_sn_block0->m_sn1) && (this->m_sn_block0->m_sn0 <= sn)) {
      this->m_e_blk = this->m_sn_block0;
      if (this->m_sn_block0->m_sorted == 0) {
        if (this->m_sn_block0->m_purged != 0) {
          Internal_HashTableInvalidate(this);
          this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
          this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
          ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
          UpdateMaxSNHelper(this);
        }
        if (this->m_sn_block0->m_count != 0) {
          Internal_HashTableInvalidate(this);
          ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
        }
        if ((this->m_sn_block0->m_sn1 < sn) || (sn < this->m_sn_block0->m_sn0)) {
          local_58 = (SN_ELEMENT *)0x0;
        }
        else {
          local_58 = ON_SN_BLOCK::BinarySearchBlockHelper(this->m_sn_block0,sn);
        }
        local_48 = local_58;
      }
      else {
        bVar1 = ON_SN_BLOCK::NeedsToBeCulled(this->m_sn_block0);
        if (bVar1) {
          Internal_HashTableInvalidate(this);
          this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
          this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
          ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
          UpdateMaxSNHelper(this);
          if ((this->m_sn_block0->m_sn1 < sn) || (sn < this->m_sn_block0->m_sn0)) {
            local_60 = (SN_ELEMENT *)0x0;
          }
          else {
            local_60 = ON_SN_BLOCK::BinarySearchBlockHelper(this->m_sn_block0,sn);
          }
          local_48 = local_60;
        }
        else {
          local_48 = ON_SN_BLOCK::BinarySearchBlockHelper(this->m_sn_block0,sn);
        }
      }
      if (local_48 != (SN_ELEMENT *)0x0) {
        return local_48;
      }
    }
    if (this->m_snblk_list_count != 0) {
      eblk = (ON_SN_BLOCK *)this->m_snblk_list;
      OVar2 = this->m_snblk_list_count;
      while (j = OVar2, j != 0) {
        OVar2 = j >> 1;
        this_00 = *(ON_SN_BLOCK **)((long)(&eblk->m_sn[0].m_id + -2) + OVar2 * 8);
        bVar1 = ON_SN_BLOCK::NeedsToBeCulled(this_00);
        if (bVar1) {
          Internal_HashTableInvalidate(this);
          this->m_sn_count = this->m_sn_count - (ulong)this_00->m_purged;
          this->m_sn_purged = this->m_sn_purged - (ulong)this_00->m_purged;
          ON_SN_BLOCK::CullBlockHelper(this_00);
          if (this_00->m_count != 0) {
            UpdateMaxSNHelper(this);
            goto LAB_006b678c;
          }
          for (e = (SN_ELEMENT *)(((long)eblk - (long)this->m_snblk_list >> 3) + 1 + OVar2);
              e < (SN_ELEMENT *)this->m_snblk_list_count;
              e = (SN_ELEMENT *)((long)&(e->m_id).Data1 + 1)) {
            this->m_snblk_list[(long)&e[-1].m_value.m_u.u64 + 7] = this->m_snblk_list[(long)e];
          }
          this->m_snblk_list_count = this->m_snblk_list_count - 1;
          this->m_snblk_list[this->m_snblk_list_count] = this_00;
          UpdateMaxSNHelper(this);
          OVar2 = j - 1;
        }
        else {
LAB_006b678c:
          if (this_00->m_sn0 <= sn) {
            if (sn <= this_00->m_sn1) {
              this->m_e_blk = this_00;
              pSVar3 = ON_SN_BLOCK::BinarySearchBlockHelper(this_00,sn);
              return pSVar3;
            }
            eblk = (ON_SN_BLOCK *)(eblk->m_sn[0].m_id.Data4 + OVar2 * 8 + -0x20);
            OVar2 = j - (OVar2 + 1);
          }
        }
      }
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FindElementHelper(ON__UINT64 sn)
{
  class ON_SN_BLOCK** eblk_array;
  class ON_SN_BLOCK* eblk;
  size_t i, j;

  if (m_private->MaxSn() < sn )
    return 0; // happens almost every time an object is added to the doc

  if (sn < UINT32_MAX && m_private->LowerMaxSn() < sn)
    return 0;

  if ( sn <= 0 )
    return 0;

  // First check m_sn_block0. For small models this
  // is the only place we need to look.
  if ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
  {
    SN_ELEMENT* e;

    m_e_blk = &m_sn_block0;
    if ( !m_sn_block0.m_sorted )
    {
      // m_sn_block0.m_sn[] needs to be sorted
      //
      // This is a rare occurrence.  It only happens
      // when commands add new objects in an order that
      // is different from that in which the CRhinoObject
      // class constructor was called.  In testing,
      // I could not find a real command that did this
      // and had to write TestAddBackwards to test this code.
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_count -= m_sn_block0.m_purged;
        m_sn_purged -= m_sn_block0.m_purged;
        m_sn_block0.CullBlockHelper();
        UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_block0.SortBlockHelper();
      }
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else if ( m_sn_block0.NeedsToBeCulled() )
    {
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();
      m_sn_count -= m_sn_block0.m_purged;
      m_sn_purged -= m_sn_block0.m_purged;
      m_sn_block0.CullBlockHelper();
      UpdateMaxSNHelper();
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else
    {
      e = m_sn_block0.BinarySearchBlockHelper(sn);
    }
    if (e)
      return e;
  }

  // look in the blocks kept in the m_sn_list[] array.
  // The m_sn[] arrays in these blocks are always sorted.
  // In addition the blocks are disjoint and stored in
  // the m_sn_list[] array in sorted order.
  if ( 0 == (i = (size_t)m_snblk_list_count) )
  {
    return 0;
  }
  eblk_array = m_snblk_list;
  while (i > 0 )
  {
    eblk = eblk_array[(j=i/2)];

    // The culling code is here rather than
    // in the binary search clause so the
    // entire ON_SerialNumberMap tends to
    // be tidy.
    if ( eblk->NeedsToBeCulled() )
    {
      // cull purged items from eblk

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();

      m_sn_count -= eblk->m_purged;
      m_sn_purged -= eblk->m_purged;
      eblk->CullBlockHelper();
      if ( 0 == eblk->m_count )
      {
        // put empty block at the end of the list
        for( j += ((eblk_array-m_snblk_list)+1); j < m_snblk_list_count; j++ )
        {
          m_snblk_list[j-1] = m_snblk_list[j];
        }
        m_snblk_list_count--;
        m_snblk_list[m_snblk_list_count] = eblk;
        i--;
        UpdateMaxSNHelper();
        continue;
      }
      UpdateMaxSNHelper();
    }

    if ( sn < eblk->m_sn0 )
    {
      i = j;
    }
    else if ( sn > eblk->m_sn1 )
    {
      j++;
      eblk_array += j;
      i -= j;
    }
    else 
    {
      m_e_blk = eblk;
      return eblk->BinarySearchBlockHelper(sn);
    }
  }

  return 0;
}